

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstsout.c
# Opt level: O3

int main(int argc,char **argv)

{
  int verbose;
  long lVar1;
  
  if (argc == 2) {
    verbose = 0;
    lVar1 = 8;
  }
  else {
    if (((argc != 3) || (*argv[1] != '-')) || (argv[1][1] != 'v')) {
      fprintf(_stderr,"Usage: %s [-v] sysout-filename\n",*argv);
      exit(-1);
    }
    verbose = 1;
    lVar1 = 0x10;
  }
  check_sysout(*(char **)((long)argv + lVar1),verbose);
  exit(0);
}

Assistant:

int main(int argc, char **argv) {
    switch (argc) {
    case 2:
        check_sysout(argv[1], 0);
        break;
    case 3:
        if (0 == strncmp(argv[1], "-v", 2)) {
            check_sysout(argv[2], 1);
        } else {
            usage(argv[0]);
        }
        break;
    default:
        usage(argv[0]);
    }
  exit(0);
}